

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O0

Preinstruction __thiscall
InstructionSet::M68k::Predecoder<(InstructionSet::M68k::Model)2>::decode
          (Predecoder<(InstructionSet::M68k::Model)2> *this,uint16_t instruction)

{
  ushort uVar1;
  uint16_t instruction_local;
  Predecoder<(InstructionSet::M68k::Model)2> *this_local;
  
  uVar1 = instruction & 0xf000;
  if ((instruction & 0xf000) == 0) {
    this_local._4_4_ = decode0(this,instruction);
  }
  else if (uVar1 == 0x1000) {
    this_local._4_4_ = decode1(this,instruction);
  }
  else if (uVar1 == 0x2000) {
    this_local._4_4_ = decode2(this,instruction);
  }
  else if (uVar1 == 0x3000) {
    this_local._4_4_ = decode3(this,instruction);
  }
  else if (uVar1 == 0x4000) {
    this_local._4_4_ = decode4(this,instruction);
  }
  else if (uVar1 == 0x5000) {
    this_local._4_4_ = decode5(this,instruction);
  }
  else if (uVar1 == 0x6000) {
    this_local._4_4_ = decode6(this,instruction);
  }
  else if (uVar1 == 0x7000) {
    this_local._4_4_ = decode7(this,instruction);
  }
  else if (uVar1 == 0x8000) {
    this_local._4_4_ = decode8(this,instruction);
  }
  else if (uVar1 == 0x9000) {
    this_local._4_4_ = decode9(this,instruction);
  }
  else if (uVar1 == 0xa000) {
    this_local._4_4_ = decodeA(this,instruction);
  }
  else if (uVar1 == 0xb000) {
    this_local._4_4_ = decodeB(this,instruction);
  }
  else if (uVar1 == 0xc000) {
    this_local._4_4_ = decodeC(this,instruction);
  }
  else if (uVar1 == 0xd000) {
    this_local._4_4_ = decodeD(this,instruction);
  }
  else if (uVar1 == 0xe000) {
    this_local._4_4_ = decodeE(this,instruction);
  }
  else if (uVar1 == 0xf000) {
    this_local._4_4_ = decodeF(this,instruction);
  }
  else {
    memset((void *)((long)&this_local + 4),0,4);
    Preinstruction::Preinstruction((Preinstruction *)((long)&this_local + 4));
  }
  return this_local._4_4_;
}

Assistant:

Preinstruction Predecoder<model>::decode(uint16_t instruction) {
	// Divide first based on line.
	switch(instruction & 0xf000) {
		case 0x0000:	return decode0(instruction);
		case 0x1000:	return decode1(instruction);
		case 0x2000:	return decode2(instruction);
		case 0x3000:	return decode3(instruction);
		case 0x4000:	return decode4(instruction);
		case 0x5000:	return decode5(instruction);
		case 0x6000:	return decode6(instruction);
		case 0x7000:	return decode7(instruction);
		case 0x8000:	return decode8(instruction);
		case 0x9000:	return decode9(instruction);
		case 0xa000:	return decodeA(instruction);
		case 0xb000:	return decodeB(instruction);
		case 0xc000:	return decodeC(instruction);
		case 0xd000:	return decodeD(instruction);
		case 0xe000:	return decodeE(instruction);
		case 0xf000:	return decodeF(instruction);

		default:	break;
	}

	return Preinstruction();
}